

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_subject_alt_name(uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  int iVar1;
  size_t in_RAX;
  size_t local_28;
  size_t len;
  
  local_28 = in_RAX;
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,0x30);
  if (iVar1 == 0) {
    iVar1 = -0x2566;
    if (*p + local_28 == end) {
      iVar1 = mbedtls_x509_get_subject_alt_name_ext(p,end,subject_alt_name);
    }
  }
  else {
    iVar1 = iVar1 + -0x2500;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_get_subject_alt_name(unsigned char **p,
                                      const unsigned char *end,
                                      mbedtls_x509_sequence *subject_alt_name)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return mbedtls_x509_get_subject_alt_name_ext(p, end, subject_alt_name);
}